

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O1

void __thiscall flatbuffers::Parser::Next(Parser *this)

{
  string *this_00;
  byte bVar1;
  byte bVar2;
  char cVar3;
  byte *pbVar4;
  bool bVar5;
  int iVar6;
  undefined8 *puVar7;
  undefined8 *extraout_RAX;
  undefined8 extraout_RAX_00;
  size_type *psVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX;
  uint uVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  byte *pbVar11;
  string ch;
  string local_a0;
  ulong local_80;
  string *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  local_78 = &this->doc_comment_;
  (this->doc_comment_)._M_string_length = 0;
  *(this->doc_comment_)._M_dataplus._M_p = '\0';
  this_00 = &this->attribute_;
  local_80 = 0;
  do {
    pbVar4 = (byte *)this->cursor_;
    pbVar11 = pbVar4 + 1;
    this->cursor_ = (char *)pbVar11;
    bVar1 = *pbVar4;
    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(ulong)(uint)(int)(char)bVar1;
    uVar9 = (uint)bVar1;
    this->token_ = (int)(char)bVar1;
    bVar5 = false;
    if (0x39 < uVar9) {
      if ((((0x23 < uVar9 - 0x3a) || ((0xa0000000bU >> ((ulong)(uVar9 - 0x3a) & 0x3f) & 1) == 0)) &&
          (uVar9 != 0x7b)) && (uVar9 != 0x7d)) goto switchD_0010a67f_caseD_21;
      goto switchD_0010a67f_caseD_28;
    }
    if (uVar9 < 0xd) {
      if (uVar9 == 0) {
        this->cursor_ = (char *)pbVar4;
        this->token_ = 0;
LAB_0010aab5:
        bVar5 = false;
      }
      else {
        if (uVar9 == 9) goto switchD_0010a67f_caseD_20;
        if (uVar9 != 10) goto switchD_0010a67f_caseD_21;
        this->line_ = this->line_ + 1;
        local_80 = CONCAT71((int7)((ulong)pbVar11 >> 8),1);
        bVar5 = true;
      }
      goto switchD_0010a67f_caseD_28;
    }
    bVar5 = false;
    switch(uVar9) {
    case 0x21:
    case 0x23:
    case 0x24:
    case 0x25:
    case 0x26:
    case 0x27:
    case 0x2a:
    case 0x2b:
    case 0x2d:
switchD_0010a67f_caseD_21:
      iVar6 = isalpha(uVar9);
      if (iVar6 != 0) {
        pbVar11 = (byte *)this->cursor_;
        uVar9 = (uint)*pbVar11;
        iVar6 = isalnum(uVar9);
        if ((uVar9 == 0x5f) || (iVar6 != 0)) {
          pbVar11 = pbVar11 + 1;
          do {
            do {
              this->cursor_ = (char *)pbVar11;
              bVar1 = *pbVar11;
              iVar6 = isalnum((uint)bVar1);
              pbVar11 = pbVar11 + 1;
            } while (bVar1 == 0x5f);
          } while (iVar6 != 0);
        }
        (this->attribute_)._M_string_length = 0;
        *(this->attribute_)._M_dataplus._M_p = '\0';
        std::__cxx11::string::replace
                  ((ulong)this_00,(this->attribute_)._M_string_length,(char *)0x0,(ulong)pbVar4);
        iVar6 = std::__cxx11::string::compare((char *)this_00);
        if (iVar6 == 0) {
          this->token_ = 0xb;
        }
        else {
          iVar6 = std::__cxx11::string::compare((char *)this_00);
          if (iVar6 == 0) {
            this->token_ = 0xc;
          }
          else {
            iVar6 = std::__cxx11::string::compare((char *)this_00);
            if (iVar6 == 0) {
              this->token_ = 0xd;
            }
            else {
              iVar6 = std::__cxx11::string::compare((char *)this_00);
              if (iVar6 == 0) {
                this->token_ = 0xe;
              }
              else {
                iVar6 = std::__cxx11::string::compare((char *)this_00);
                if (iVar6 == 0) {
                  this->token_ = 0xf;
                }
                else {
                  iVar6 = std::__cxx11::string::compare((char *)this_00);
                  if (iVar6 == 0) {
                    this->token_ = 0x10;
                  }
                  else {
                    iVar6 = std::__cxx11::string::compare((char *)this_00);
                    if (iVar6 == 0) {
                      this->token_ = 0x11;
                    }
                    else {
                      iVar6 = std::__cxx11::string::compare((char *)this_00);
                      if (iVar6 == 0) {
                        this->token_ = 0x12;
                      }
                      else {
                        iVar6 = std::__cxx11::string::compare((char *)this_00);
                        if (iVar6 == 0) {
                          this->token_ = 0x13;
                        }
                        else {
                          iVar6 = std::__cxx11::string::compare((char *)this_00);
                          if (iVar6 == 0) {
                            this->token_ = 0x14;
                          }
                          else {
                            iVar6 = std::__cxx11::string::compare((char *)this_00);
                            if (iVar6 == 0) {
                              this->token_ = 0x15;
                            }
                            else {
                              iVar6 = std::__cxx11::string::compare((char *)this_00);
                              if (iVar6 == 0) {
                                this->token_ = 0x16;
                              }
                              else {
                                iVar6 = std::__cxx11::string::compare((char *)this_00);
                                if (iVar6 == 0) {
                                  this->token_ = 0x17;
                                }
                                else {
                                  iVar6 = std::__cxx11::string::compare((char *)this_00);
                                  if (iVar6 == 0) {
                                    this->token_ = 0x18;
                                  }
                                  else {
                                    iVar6 = std::__cxx11::string::compare((char *)this_00);
                                    if (iVar6 == 0) {
                                      this->token_ = 0x19;
                                    }
                                    else {
                                      iVar6 = std::__cxx11::string::compare((char *)this_00);
                                      if (iVar6 == 0) {
                                        this->token_ = 0x1a;
                                      }
                                      else {
                                        iVar6 = std::__cxx11::string::compare((char *)this_00);
                                        if (iVar6 == 0) {
                                          this->token_ = 0x1b;
                                        }
                                        else {
                                          iVar6 = std::__cxx11::string::compare((char *)this_00);
                                          if ((iVar6 == 0) ||
                                             (iVar6 = std::__cxx11::string::compare((char *)this_00)
                                             , iVar6 == 0)) {
                                            iVar6 = std::__cxx11::string::compare((char *)this_00);
                                            NumToString<bool>(&local_a0,iVar6 == 0);
                                            std::__cxx11::string::operator=
                                                      ((string *)this_00,(string *)&local_a0);
                                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                 *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
                                              operator_delete(local_a0._M_dataplus._M_p);
                                            }
                                            this->token_ = 2;
                                          }
                                          else {
                                            iVar6 = std::__cxx11::string::compare((char *)this_00);
                                            if (iVar6 == 0) {
                                              this->token_ = 5;
                                            }
                                            else {
                                              iVar6 = std::__cxx11::string::compare((char *)this_00)
                                              ;
                                              if (iVar6 == 0) {
                                                this->token_ = 6;
                                              }
                                              else {
                                                iVar6 = std::__cxx11::string::compare
                                                                  ((char *)this_00);
                                                if (iVar6 == 0) {
                                                  this->token_ = 7;
                                                }
                                                else {
                                                  iVar6 = std::__cxx11::string::compare
                                                                    ((char *)this_00);
                                                  if (iVar6 == 0) {
                                                    this->token_ = 8;
                                                  }
                                                  else {
                                                    iVar6 = std::__cxx11::string::compare
                                                                      ((char *)this_00);
                                                    if (iVar6 == 0) {
                                                      this->token_ = 9;
                                                    }
                                                    else {
                                                      iVar6 = std::__cxx11::string::compare
                                                                        ((char *)this_00);
                                                      if (iVar6 == 0) {
                                                        this->token_ = 10;
                                                      }
                                                      else {
                                                        this->token_ = 4;
                                                      }
                                                    }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        goto LAB_0010ad2b;
      }
      if (uVar9 != 0x2d && 9 < uVar9 - 0x30) goto LAB_0010ae15;
      pbVar11 = (byte *)this->cursor_;
      bVar1 = *pbVar11;
      while (bVar1 - 0x30 < 10) {
        pbVar11 = pbVar11 + 1;
        this->cursor_ = (char *)pbVar11;
        bVar1 = *pbVar11;
      }
      iVar6 = 2;
      if (bVar1 == 0x2e) {
        do {
          pbVar11 = pbVar11 + 1;
          this->cursor_ = (char *)pbVar11;
        } while (*pbVar11 - 0x30 < 10);
        iVar6 = 3;
      }
      this->token_ = iVar6;
      (this->attribute_)._M_string_length = 0;
      *(this->attribute_)._M_dataplus._M_p = '\0';
      std::__cxx11::string::replace
                ((ulong)this_00,(this->attribute_)._M_string_length,(char *)0x0,(ulong)pbVar4);
      bVar5 = false;
      break;
    case 0x22:
      std::__cxx11::string::_M_replace
                ((ulong)this_00,0,(char *)(this->attribute_)._M_string_length,0x116c91);
      while( true ) {
        bVar2 = *this->cursor_;
        if (bVar2 == 0x22) break;
        if (bVar2 < 0x20) {
          local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_a0,"illegal character in string constant","");
          Error(&local_a0);
          goto LAB_0010adc1;
        }
        pbVar11 = (byte *)(this->cursor_ + 1);
        cVar3 = *this->cursor_;
        this->cursor_ = (char *)pbVar11;
        if (cVar3 == '\\') {
          bVar2 = *pbVar11;
          if (bVar2 < 0x6e) {
            if ((bVar2 != 0x22) && (bVar2 != 0x5c)) goto LAB_0010adc1;
          }
          else if ((bVar2 != 0x74) && ((bVar2 != 0x72 && (bVar2 != 0x6e)))) {
LAB_0010adc1:
            local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_a0,"unknown escape code in string constant","");
            Error(&local_a0);
            goto LAB_0010adeb;
          }
          std::__cxx11::string::push_back((char)this_00);
          this->cursor_ = this->cursor_ + 1;
        }
        else {
          std::__cxx11::string::push_back((char)this_00);
        }
      }
      this->cursor_ = this->cursor_ + 1;
      this->token_ = 1;
LAB_0010ad2b:
      bVar5 = false;
      break;
    case 0x28:
    case 0x29:
    case 0x2c:
      break;
    case 0x2e:
      if (9 < (int)(char)*pbVar11 - 0x30U) goto LAB_0010aab5;
LAB_0010adeb:
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,"floating point constant can\'t start with \".\"","");
      Error(&local_a0);
LAB_0010ae15:
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      local_a0._M_string_length = 0;
      local_a0.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::_M_replace_aux((ulong)&local_a0,0,0,'\x01');
      if (0xa0 < (byte)(bVar1 + 0x81)) goto LAB_0010af17;
      NumToString<char>(&local_50,bVar1);
      puVar7 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x1162c5);
      paVar10 = &local_70.field_2;
      local_70._M_dataplus._M_p = (pointer)*puVar7;
      psVar8 = puVar7 + 2;
      if ((size_type *)local_70._M_dataplus._M_p != psVar8) goto LAB_0010aec1;
      local_70.field_2._M_allocated_capacity = *psVar8;
      local_70.field_2._8_8_ = puVar7[3];
      local_70._M_dataplus._M_p = (pointer)paVar10;
      goto LAB_0010aece;
    case 0x2f:
      if (*pbVar11 != 0x2f) goto switchD_0010a67f_caseD_21;
      psVar8 = (size_type *)(pbVar4 + 2);
      while( true ) {
        this->cursor_ = (char *)psVar8;
        if (((byte)*psVar8 == 0) || ((byte)*psVar8 == 10)) break;
        psVar8 = (size_type *)((long)psVar8 + 1);
      }
      bVar5 = true;
      if ((byte)*(size_type *)(pbVar4 + 2) != 0x2f) break;
      if ((local_80 & 1) != 0) {
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a0,pbVar4 + 3,this->cursor_);
        std::__cxx11::string::_M_append((char *)local_78,(ulong)local_a0._M_dataplus._M_p);
        bVar5 = true;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p);
        }
        break;
      }
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,"a documentation comment should be on a line on its own","");
      Error(&local_a0);
      puVar7 = extraout_RAX;
      local_70._M_dataplus._M_p = (pointer)extraout_RDX;
LAB_0010aec1:
      local_70.field_2._M_allocated_capacity = *psVar8;
LAB_0010aece:
      local_70._M_string_length = puVar7[1];
      *puVar7 = psVar8;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar10) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
LAB_0010af17:
      std::operator+(&local_70,"illegal character: ",&local_a0);
      Error(&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p);
      }
      _Unwind_Resume(extraout_RAX_00);
    default:
      if (uVar9 != 0xd) goto switchD_0010a67f_caseD_21;
    case 0x20:
switchD_0010a67f_caseD_20:
      bVar5 = true;
    }
switchD_0010a67f_caseD_28:
    if (!bVar5) {
      return;
    }
  } while( true );
}

Assistant:

void Parser::Next() {
  doc_comment_.clear();
  bool seen_newline = false;
  for (;;) {
    char c = *cursor_++;
    token_ = c;
    switch (c) {
      case '\0': cursor_--; token_ = kTokenEof; return;
      case ' ': case '\r': case '\t': break;
      case '\n': line_++; seen_newline = true; break;
      case '{': case '}': case '(': case ')': case '[': case ']': return;
      case ',': case ':': case ';': case '=': return;
      case '.':
        if(!isdigit(*cursor_)) return;
        Error("floating point constant can\'t start with \".\"");
        break;
      case '\"':
        attribute_ = "";
        while (*cursor_ != '\"') {
          if (*cursor_ < ' ' && *cursor_ >= 0)
            Error("illegal character in string constant");
          if (*cursor_ == '\\') {
            cursor_++;
            switch (*cursor_) {
              case 'n':  attribute_ += '\n'; cursor_++; break;
              case 't':  attribute_ += '\t'; cursor_++; break;
              case 'r':  attribute_ += '\r'; cursor_++; break;
              case '\"': attribute_ += '\"'; cursor_++; break;
              case '\\': attribute_ += '\\'; cursor_++; break;
              default: Error("unknown escape code in string constant"); break;
            }
          } else { // printable chars + UTF-8 bytes
            attribute_ += *cursor_++;
          }
        }
        cursor_++;
        token_ = kTokenStringConstant;
        return;
      case '/':
        if (*cursor_ == '/') {
          const char *start = ++cursor_;
          while (*cursor_ && *cursor_ != '\n') cursor_++;
          if (*start == '/') {  // documentation comment
            if (!seen_newline)
              Error("a documentation comment should be on a line on its own");
            // todo: do we want to support multiline comments instead?
            doc_comment_ += std::string(start + 1, cursor_);
          }
          break;
        }
        // fall thru
      default:
        if (isalpha(static_cast<unsigned char>(c))) {
          // Collect all chars of an identifier:
          const char *start = cursor_ - 1;
          while (isalnum(static_cast<unsigned char>(*cursor_)) ||
                 *cursor_ == '_')
            cursor_++;
          attribute_.clear();
          attribute_.append(start, cursor_);
          // First, see if it is a type keyword from the table of types:
          #define FLATBUFFERS_TD(ENUM, IDLTYPE, CTYPE, JTYPE) \
            if (attribute_ == IDLTYPE) { \
              token_ = kToken ## ENUM; \
              return; \
            }
            FLATBUFFERS_GEN_TYPES(FLATBUFFERS_TD)
          #undef FLATBUFFERS_TD
          // If it's a boolean constant keyword, turn those into integers,
          // which simplifies our logic downstream.
          if (attribute_ == "true" || attribute_ == "false") {
            attribute_ = NumToString(attribute_ == "true");
            token_ = kTokenIntegerConstant;
            return;
          }
          // Check for declaration keywords:
          if (attribute_ == "table")     { token_ = kTokenTable;     return; }
          if (attribute_ == "struct")    { token_ = kTokenStruct;    return; }
          if (attribute_ == "enum")      { token_ = kTokenEnum;      return; }
          if (attribute_ == "union")     { token_ = kTokenUnion;     return; }
          if (attribute_ == "namespace") { token_ = kTokenNameSpace; return; }
          if (attribute_ == "root_type") { token_ = kTokenRootType;  return; }
          // If not, it is a user-defined identifier:
          token_ = kTokenIdentifier;
          return;
        } else if (isdigit(static_cast<unsigned char>(c)) || c == '-') {
          const char *start = cursor_ - 1;
          while (isdigit(static_cast<unsigned char>(*cursor_))) cursor_++;
          if (*cursor_ == '.') {
            cursor_++;
            while (isdigit(static_cast<unsigned char>(*cursor_))) cursor_++;
            token_ = kTokenFloatConstant;
          } else {
            token_ = kTokenIntegerConstant;
          }
          attribute_.clear();
          attribute_.append(start, cursor_);
          return;
        }
        std::string ch;
        ch = c;
        if (c < ' ' || c > '~') ch = "code: " + NumToString(c);
        Error("illegal character: " + ch);
        break;
    }
  }
}